

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O0

void __thiscall bsim::dynamic_bit_vector::dynamic_bit_vector(dynamic_bit_vector *this,int N_)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  int in_ESI;
  dynamic_bit_vector *in_RDI;
  int i_1;
  uint i;
  dynamic_bit_vector *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffe4;
  
  this_00 = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x21ab64);
  this_00->N = in_ESI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  for (uVar5 = 0; uVar1 = (ulong)uVar5,
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&in_RDI->bits),
      uVar1 < sVar2; uVar5 = uVar5 + 1) {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&in_RDI->bits,(ulong)uVar5);
    *pvVar3 = '\0';
  }
  for (iVar4 = 0; iVar4 < in_RDI->N; iVar4 = iVar4 + 1) {
    set(this_00,(int)((ulong)in_RDI >> 0x20),(uchar)((ulong)in_RDI >> 0x18));
  }
  return;
}

Assistant:

dynamic_bit_vector(const int N_) : N(N_) {
      bits.resize(NUM_BYTES(N));
      for (uint i = 0; i < bits.size(); i++) {
	bits[i] = 0;
      }
      
      for (int i = 0; i < N; i++) {
	set(i, 0);
      }
    }